

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O0

char * Gia_MmFlexEntryFetch(Gia_MmFlex_t *p,int nBytes)

{
  int iVar1;
  char *pcVar2;
  char **local_28;
  char *pTemp;
  int nBytes_local;
  Gia_MmFlex_t *p_local;
  
  if ((p->pCurrent == (char *)0x0) || (p->pEnd < p->pCurrent + nBytes)) {
    if (p->nChunks == p->nChunksAlloc) {
      p->nChunksAlloc = p->nChunksAlloc << 1;
      if (p->pChunks == (char **)0x0) {
        local_28 = (char **)malloc((long)p->nChunksAlloc << 3);
      }
      else {
        local_28 = (char **)realloc(p->pChunks,(long)p->nChunksAlloc << 3);
      }
      p->pChunks = local_28;
    }
    if (p->nChunkSize < nBytes) {
      p->nChunkSize = nBytes << 1;
    }
    pcVar2 = (char *)malloc((long)p->nChunkSize);
    p->pCurrent = pcVar2;
    p->pEnd = p->pCurrent + p->nChunkSize;
    p->nMemoryAlloc = p->nChunkSize + p->nMemoryAlloc;
    iVar1 = p->nChunks;
    p->nChunks = iVar1 + 1;
    p->pChunks[iVar1] = p->pCurrent;
  }
  if (p->pCurrent + nBytes <= p->pEnd) {
    p->nEntriesUsed = p->nEntriesUsed + 1;
    p->nMemoryUsed = nBytes + p->nMemoryUsed;
    pcVar2 = p->pCurrent;
    p->pCurrent = p->pCurrent + nBytes;
    return pcVar2;
  }
  __assert_fail("p->pCurrent + nBytes <= p->pEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMem.c"
                ,0x185,"char *Gia_MmFlexEntryFetch(Gia_MmFlex_t *, int)");
}

Assistant:

char * Gia_MmFlexEntryFetch( Gia_MmFlex_t * p, int nBytes )
{
    char * pTemp;
    // check if there are still free entries
    if ( p->pCurrent == NULL || p->pCurrent + nBytes > p->pEnd )
    { // need to allocate more entries
        if ( p->nChunks == p->nChunksAlloc )
        {
            p->nChunksAlloc *= 2;
            p->pChunks = ABC_REALLOC( char *, p->pChunks, p->nChunksAlloc ); 
        }
        if ( nBytes > p->nChunkSize )
        {
            // resize the chunk size if more memory is requested than it can give
            // (ideally, this should never happen)
            p->nChunkSize = 2 * nBytes;
        }
        p->pCurrent = ABC_ALLOC( char, p->nChunkSize );
        p->pEnd     = p->pCurrent + p->nChunkSize;
        p->nMemoryAlloc += p->nChunkSize;
        // add the chunk to the chunk storage
        p->pChunks[ p->nChunks++ ] = p->pCurrent;
    }
    assert( p->pCurrent + nBytes <= p->pEnd );
    // increment the counter of used entries
    p->nEntriesUsed++;
    // keep track of the memory used
    p->nMemoryUsed += nBytes;
    // return the next entry
    pTemp = p->pCurrent;
    p->pCurrent += nBytes;
    return pTemp;
}